

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_decomp.c
# Opt level: O2

int Doolittle64(uchar *mat,int *pivot,int n)

{
  uint uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  int j;
  uint uVar10;
  uchar *puVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uchar *puVar16;
  uint uVar17;
  uchar *puVar18;
  char cVar19;
  ulong uVar20;
  long lVar21;
  int i;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  ulong uVar26;
  byte bVar27;
  int c;
  ulong uVar28;
  bool bVar29;
  int local_90;
  ulong local_80;
  
  uVar1 = n - 1;
  uVar6 = n / 0x40;
  lVar7 = (long)(int)uVar6;
  uVar26 = 0;
  if (0 < (int)uVar6) {
    uVar26 = (ulong)uVar6;
  }
  uVar13 = 0;
  if (0 < (int)uVar1) {
    uVar13 = (ulong)uVar1;
  }
  lVar14 = (long)(n / 8);
  lVar2 = lVar7 * 8;
  puVar16 = mat + lVar7 * 8;
  local_80 = 1;
  puVar18 = mat;
  uVar25 = 0;
  while( true ) {
    if (uVar25 == uVar13) {
      pivot[(int)uVar1] = uVar1;
      return (mat[(long)((n / 8) * n) + -1] & 1) - 1;
    }
    uVar24 = (uint)uVar25;
    pivot[uVar25] = uVar24;
    uVar8 = uVar25 >> 3 & 0x1fffffff;
    uVar6 = ~uVar24 & 7;
    lVar9 = uVar25 * lVar14;
    uVar15 = uVar25 & 0xffffffff;
    uVar3 = uVar25 + 1;
    puVar11 = puVar16;
    for (uVar20 = uVar3; uVar20 < (ulong)(long)n; uVar20 = uVar20 + 1) {
      bVar29 = ((~(uint)mat[uVar8 + lVar9] & (uint)mat[uVar20 * lVar14 + uVar8]) >> uVar6 & 1) != 0;
      uVar22 = (ulong)bVar29;
      uVar23 = -uVar22;
      uVar22 = uVar22 - 1;
      for (uVar28 = 0; uVar26 != uVar28; uVar28 = uVar28 + 1) {
        uVar4 = *(ulong *)(puVar11 + uVar28 * 8);
        *(ulong *)(puVar11 + uVar28 * 8) =
             *(ulong *)(puVar18 + uVar28 * 8) & uVar23 | uVar4 & uVar22;
        *(ulong *)(puVar18 + uVar28 * 8) =
             uVar4 & uVar23 | *(ulong *)(puVar18 + uVar28 * 8) & uVar22;
      }
      uVar12 = (uint)uVar15;
      if (bVar29) {
        uVar12 = 0;
      }
      uVar12 = uVar12 | (uint)uVar23 & (uint)uVar20;
      uVar15 = (ulong)uVar12;
      pivot[uVar25] = uVar12;
      puVar11 = puVar11 + lVar2;
    }
    local_90 = (int)uVar8;
    if ((mat[(int)(uVar24 * n) / 8 + local_90] >> uVar6 & 1) == 0) break;
    uVar12 = (uint)uVar3 & 7;
    uVar17 = (uint)uVar3 >> 3;
    cVar19 = (char)(0x100 >> (sbyte)uVar12);
    for (uVar20 = local_80; uVar20 != (uint)n; uVar20 = uVar20 + 1) {
      iVar5 = -(uint)((mat[((int)uVar20 * n) / 8 + local_90] >> uVar6 & 1) != 0);
      lVar21 = uVar20 * lVar14;
      bVar27 = (byte)iVar5;
      mat[lVar21 + (ulong)uVar17] =
           (mat[lVar9 + (ulong)uVar17] & bVar27 ^ mat[lVar21 + (ulong)uVar17]) & cVar19 - 1U |
           mat[lVar21 + (ulong)uVar17] & -cVar19;
      for (uVar10 = (uVar24 - uVar12) + 9; ((int)uVar10 < n && ((uVar10 & 0x3f) != 0));
          uVar10 = uVar10 + 8) {
        mat[(int)uVar10 / 8 + lVar21] =
             mat[(int)uVar10 / 8 + lVar21] ^ mat[(int)uVar10 / 8 + lVar9] & bVar27;
      }
      for (; (int)uVar10 < n; uVar10 = uVar10 + 0x40) {
        *(ulong *)(mat + (long)((int)uVar10 / 0x40) * 8 + uVar20 * lVar7 * 8) =
             *(ulong *)(mat + (long)((int)uVar10 / 0x40) * 8 + uVar20 * lVar7 * 8) ^
             *(ulong *)(mat + (long)((int)uVar10 / 0x40) * 8 + uVar25 * lVar7 * 8) & (long)iVar5;
      }
    }
    local_80 = local_80 + 1;
    puVar18 = puVar18 + lVar2;
    puVar16 = puVar16 + lVar2;
    uVar25 = uVar3;
  }
  return -1;
}

Assistant:

int Doolittle64(unsigned char *mat, int *pivot, int n)
{
  uint64_t *mat_64_ptr = (uint64_t*)mat;

  for(int k = 0; k < n-1; k++)
  {

    /*
     * swap rows in constant time ...
     */

    pivot[k] = k;

    uint64_t tmp;
    for(uint64_t j = k+1; j < n; j++)
    {
      uint64_t mask_cpy = (mat[(n/8)*j + k/8] >> (7 - (k % 8))) & 1; // note: type has to be large enough to use as mask with j in pivot computing
      mask_cpy = mask_cpy & !((mat[(n/8)*k + k/8] >> (7 - (k % 8))) & 1);  // add this in order to only actually switch with the first suitable row => consistent with "ref" non-constant-time impl
      mask_cpy = -mask_cpy;
      for(int c = 0; c < n/64; c++)
      {
        // copy in 32 bit chunks
        tmp = mat_64_ptr[(n/64)*j + c];
        mat_64_ptr[(n/64)*j + c] = (mat_64_ptr[(n/64)*j + c] & ~mask_cpy) | (mat_64_ptr[(n/64)*k + c] & mask_cpy);
        mat_64_ptr[(n/64)*k + c] = (mat_64_ptr[(n/64)*k + c] & ~mask_cpy) | (tmp & mask_cpy);
      }

      // update pivot
      pivot[k] = (j & mask_cpy) | (pivot[k] & ~mask_cpy);
    }

    if (!((mat[k*n/8 + (k/8)] >> (7 - (k % 8))) & 1))
    {
      return -1;
    }

    for(int i = k+1; i < n; i++)
    {
      // 0x00 iff A(i,k) is zero. Otherweise 0xFF
      uint64_t mask_ik = 0x0000000000000000 - ((mat[i*n/8 + (k/8)] >> (7 - (k % 8))) & 1);

      /*
       * First, handle the case that j = k+1 is not divisible by 8; i.e. only handle the last j%8 bits of this byte
       */
      unsigned char mask_prepending = (unsigned char) (0x100 >> ((k+1) % 8)) - 1;

      unsigned char tmp = mat[n/8*i + (k+1)/8] & ~mask_prepending; // store the left side of the splitted byte in tmp
      mat[i*(n/8) + (k+1)/8]  ^= (mask_ik & mat[k*(n/8) + (k+1)/8]);

      // restore the left bits: first set bits 0, then 'or' tmp
      mat[n/8*i + (k+1)/8] &= mask_prepending;
      mat[n/8*i + (k+1)/8] |= tmp;

      // handle byte-aligned chunks until we are 8-byte aligned
      int k_1_aligned = k+1 + (8-((k+1)%8));
      int k_8_aligned = k_1_aligned;
      for(int j = k_1_aligned; (j < n) && ((j%64) != 0); j += 8)
      {
        mat[i*(n/8) + j/8] ^= mask_ik & mat[k*(n/8) + j/8];
        k_8_aligned = j+8;
      }

      /*
       * now handle the rest of the row efficiently in 4-byte-aligned byte-chunks
       */
      for(int j = k_8_aligned; j < n; j += 64)
      {
        mat_64_ptr[i*(n/64) + j/64] ^= mask_ik & mat_64_ptr[k*(n/64) + j/64];
      }
    }
  }
  pivot[n-1] = n-1;

  if ((mat[(n/8)*(n-1) + n/8-1] & 0x01) == 0)
  {
    return -1;
  }
  return 0;
}